

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
::SetBufferOffset(ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                  *this,Uint32 Offset,Uint32 ArrayIndex)

{
  PIPELINE_RESOURCE_FLAGS PVar1;
  Char *pCVar2;
  undefined1 local_70 [8];
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  PipelineResourceDesc *Desc;
  Uint32 ArrayIndex_local;
  Uint32 Offset_local;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_local;
  
  msg.field_2._8_8_ = GetDesc(this);
  PVar1 = Diligent::operator&(((PipelineResourceDesc *)msg.field_2._8_8_)->Flags,
                              PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS);
  if (PVar1 != PIPELINE_RESOURCE_FLAG_NONE) {
    FormatString<char[113]>
              ((string *)local_40,
               (char (*) [113])
               "SetBufferOffset() is not only allowed for variables created with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag."
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"SetBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x2c2);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (*(char *)(msg.field_2._8_8_ + 0x11) == '\0') {
    FormatString<char[55]>
              ((string *)local_70,
               (char (*) [55])"SetBufferOffset() is not allowed for static variables.");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"SetBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x2c4);
    std::__cxx11::string::~string((string *)local_70);
  }
  ShaderVariableManagerGL::UniformBuffBindInfo::SetDynamicOffset
            ((UniformBuffBindInfo *)this,ArrayIndex,Offset);
  return;
}

Assistant:

SetBufferOffset(Uint32 Offset,
                                                    Uint32 ArrayIndex) override final
    {
#ifdef DILIGENT_DEVELOPMENT
        {
            const PipelineResourceDesc& Desc = GetDesc();
            DEV_CHECK_ERR((Desc.Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) == 0,
                          "SetBufferOffset() is not only allowed for variables created with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag.");
            DEV_CHECK_ERR(Desc.VarType != SHADER_RESOURCE_VARIABLE_TYPE_STATIC,
                          "SetBufferOffset() is not allowed for static variables.");
        }
#endif

        static_cast<ThisImplType*>(this)->SetDynamicOffset(ArrayIndex, Offset);
    }